

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::GroupedAggregateHashTable::InitializePartitionedData(GroupedAggregateHashTable *this)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_01;
  BufferManager *args;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var2;
  pointer pPVar3;
  idx_t iVar4;
  TupleDataLayout *pTVar5;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> local_40;
  unsigned_long local_38;
  
  this_01 = &this->partitioned_data;
  if ((this->partitioned_data).
      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl !=
      (PartitionedTupleData *)0x0) {
    pPVar3 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator->(this_01);
    iVar4 = PartitionedTupleData::PartitionCount(pPVar3);
    iVar4 = RadixPartitioning::RadixBitsOfPowerOfTwo(iVar4);
    if (iVar4 == this->radix_bits) {
      pPVar3 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_01);
      PartitionedTupleData::Reset(pPVar3);
      goto LAB_003f4895;
    }
  }
  args = (this->super_BaseAggregateHashTable).buffer_manager;
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  pTVar5 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  local_38 = ((long)(pTVar5->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar5->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1;
  make_uniq<duckdb::RadixPartitionedTupleData,duckdb::BufferManager&,duckdb::shared_ptr<duckdb::TupleDataLayout,true>&,unsigned_long&,unsigned_long>
            ((duckdb *)&local_40,args,this_00,&this->radix_bits,&local_38);
  _Var2._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (PartitionedTupleData *)0x0;
  _Var1._M_head_impl =
       (this->partitioned_data).
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  (this->partitioned_data).
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_PartitionedTupleData + 8))();
    if (local_40._M_head_impl != (PartitionedTupleData *)0x0) {
      (*(local_40._M_head_impl)->_vptr_PartitionedTupleData[1])();
    }
  }
LAB_003f4895:
  pPVar3 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(this_01);
  PartitionedTupleData::InitializeAppendState
            (pPVar3,&(this->state).partitioned_append_state,KEEP_EVERYTHING_PINNED);
  return;
}

Assistant:

void GroupedAggregateHashTable::InitializePartitionedData() {
	if (!partitioned_data ||
	    RadixPartitioning::RadixBitsOfPowerOfTwo(partitioned_data->PartitionCount()) != radix_bits) {
		D_ASSERT(!partitioned_data || partitioned_data->Count() == 0);
		partitioned_data =
		    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, radix_bits, layout_ptr->ColumnCount() - 1);
	} else {
		partitioned_data->Reset();
	}

	D_ASSERT(GetLayout().GetAggrWidth() == layout_ptr->GetAggrWidth());
	D_ASSERT(GetLayout().GetDataWidth() == layout_ptr->GetDataWidth());
	D_ASSERT(GetLayout().GetRowWidth() == layout_ptr->GetRowWidth());

	partitioned_data->InitializeAppendState(state.partitioned_append_state,
	                                        TupleDataPinProperties::KEEP_EVERYTHING_PINNED);
}